

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

int __thiscall
cmMakefile::ConfigureFile
          (cmMakefile *this,char *infile,char *outfile,bool copyonly,bool atOnly,bool escapeQuotes,
          cmNewLineStyle *newLine)

{
  bool bVar1;
  byte bVar2;
  BOM BVar3;
  char *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  undefined1 local_720 [8];
  string outLine;
  string inLine;
  undefined8 local_6d8;
  string local_6d0;
  undefined1 local_6b0 [8];
  ostringstream e;
  long lStack_530;
  BOM bom;
  ifstream fin;
  undefined1 local_328 [8];
  ofstream fout;
  string tempOutputFile;
  _Ios_Openmode local_e4;
  string local_e0 [4];
  openmode omode;
  string newLineCharacters;
  string local_b8 [8];
  string path;
  size_type pos;
  mode_t perm;
  string sinfile;
  allocator local_51;
  undefined1 local_50 [8];
  string soutfile;
  int res;
  bool escapeQuotes_local;
  bool atOnly_local;
  bool copyonly_local;
  char *outfile_local;
  char *infile_local;
  cmMakefile *this_local;
  
  soutfile.field_2._8_4_ = 1;
  soutfile.field_2._M_local_buf[0xd] = escapeQuotes;
  soutfile.field_2._M_local_buf[0xe] = atOnly;
  soutfile.field_2._M_local_buf[0xf] = copyonly;
  bVar1 = CanIWriteThisFile(this,outfile);
  if (!bVar1) {
    cmSystemTools::Error("Attempt to write file: ",outfile," into a source directory.",(char *)0x0);
    return 0;
  }
  bVar1 = cmsys::SystemTools::FileExists(infile);
  if (!bVar1) {
    cmSystemTools::Error("File ",infile," does not exist.",(char *)0x0);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,outfile,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&perm,infile,(allocator *)((long)&pos + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  AddCMakeDependFile(this,(string *)&perm);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_50);
  AddCMakeOutputFile(this,(string *)local_50);
  pos._0_4_ = 0;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::GetPermissions(pcVar4,(mode_t *)&pos);
  path.field_2._8_8_ = std::__cxx11::string::rfind((char)local_50,0x2f);
  if (path.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_b8,(ulong)local_50);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar4);
    std::__cxx11::string::~string(local_b8);
  }
  if ((soutfile.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::string(local_e0);
    local_e4 = std::operator|(_S_out,_S_trunc);
    bVar1 = cmNewLineStyle::IsValid(newLine);
    if (bVar1) {
      cmNewLineStyle::GetCharacters_abi_cxx11_
                ((string *)((long)&tempOutputFile.field_2 + 8),newLine);
      std::__cxx11::string::operator=(local_e0,(string *)(tempOutputFile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(tempOutputFile.field_2._M_local_buf + 8));
      std::operator|=(&local_e4,_S_bin);
    }
    else {
      std::__cxx11::string::operator=(local_e0,"\n");
    }
    std::__cxx11::string::string((string *)&fout.field_0x1f8,(string *)local_50);
    std::__cxx11::string::operator+=((string *)&fout.field_0x1f8,".tmp");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_328,pcVar4,local_e4);
    bVar2 = std::ios::operator!((ios *)(local_328 + (long)*(_func_int **)((long)local_328 + -0x18)))
    ;
    if ((bVar2 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&stack0xfffffffffffffad0,pcVar4,_S_in);
      bVar2 = std::ios::operator!((ios *)((long)&stack0xfffffffffffffad0 +
                                         *(long *)(lStack_530 + -0x18)));
      if ((bVar2 & 1) == 0) {
        BVar3 = cmsys::FStream::ReadBOM((istream *)&stack0xfffffffffffffad0);
        if ((BVar3 == BOM_None) || (BVar3 == BOM_UTF8)) {
          std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)((long)&inLine.field_2 + 8),0);
          std::istream::seekg(&stack0xfffffffffffffad0,inLine.field_2._8_8_,local_6d8);
          std::__cxx11::string::string((string *)(outLine.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_720);
          while (bVar1 = cmsys::SystemTools::GetLineFromStream
                                   ((istream *)&stack0xfffffffffffffad0,
                                    (string *)((long)&outLine.field_2 + 8),(bool *)0x0,-1), bVar1) {
            std::__cxx11::string::operator=((string *)local_720,"");
            ConfigureString(this,(string *)((long)&outLine.field_2 + 8),(string *)local_720,
                            (bool)(soutfile.field_2._M_local_buf[0xe] & 1),
                            (bool)(soutfile.field_2._M_local_buf[0xd] & 1));
            pcVar4 = (char *)std::__cxx11::string::c_str();
            poVar6 = std::operator<<((ostream *)local_328,pcVar4);
            std::operator<<(poVar6,local_e0);
          }
          std::ifstream::close();
          std::ofstream::close();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmSystemTools::CopyFileIfDifferent(pcVar4,pcVar5);
          if (bVar1) {
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::SetPermissions(pcVar4,(mode_t)pos,false);
          }
          else {
            soutfile.field_2._8_4_ = 0;
          }
          cmsys::SystemTools::RemoveFile((string *)&fout.field_0x1f8);
          std::__cxx11::string::~string((string *)local_720);
          std::__cxx11::string::~string((string *)(outLine.field_2._M_local_buf + 8));
          newLineCharacters.field_2._12_4_ = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b0);
          poVar6 = std::operator<<((ostream *)local_6b0,
                                   "File starts with a Byte-Order-Mark that is not UTF-8:\n  ");
          std::operator<<(poVar6,(string *)&perm);
          std::__cxx11::ostringstream::str();
          IssueMessage(this,FATAL_ERROR,&local_6d0,false);
          std::__cxx11::string::~string((string *)&local_6d0);
          this_local._4_4_ = 0;
          newLineCharacters.field_2._12_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b0);
        }
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Error
                  ("Could not open file for read in copy operation ",pcVar4,(char *)0x0,(char *)0x0)
        ;
        this_local._4_4_ = 0;
        newLineCharacters.field_2._12_4_ = 1;
      }
      std::ifstream::~ifstream(&stack0xfffffffffffffad0);
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error
                ("Could not open file for write in copy operation ",pcVar4,(char *)0x0,(char *)0x0);
      cmSystemTools::ReportLastSystemError("");
      this_local._4_4_ = 0;
      newLineCharacters.field_2._12_4_ = 1;
    }
    std::ofstream::~ofstream(local_328);
    std::__cxx11::string::~string((string *)&fout.field_0x1f8);
    std::__cxx11::string::~string(local_e0);
    if (newLineCharacters.field_2._12_4_ != 0) goto LAB_006e5de5;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmSystemTools::CopyFileIfDifferent(pcVar4,pcVar5);
    if (!bVar1) {
      this_local._4_4_ = 0;
      newLineCharacters.field_2._12_4_ = 1;
      goto LAB_006e5de5;
    }
  }
  this_local._4_4_ = soutfile.field_2._8_4_;
  newLineCharacters.field_2._12_4_ = 1;
LAB_006e5de5:
  std::__cxx11::string::~string((string *)&perm);
  std::__cxx11::string::~string((string *)local_50);
  return this_local._4_4_;
}

Assistant:

int cmMakefile::ConfigureFile(const char* infile, const char* outfile,
                              bool copyonly, bool atOnly, bool escapeQuotes,
                              const cmNewLineStyle& newLine)
{
  int res = 1;
  if ( !this->CanIWriteThisFile(outfile) )
    {
    cmSystemTools::Error("Attempt to write file: ",
                         outfile, " into a source directory.");
    return 0;
    }
  if ( !cmSystemTools::FileExists(infile) )
    {
    cmSystemTools::Error("File ", infile, " does not exist.");
    return 0;
    }
  std::string soutfile = outfile;
  std::string sinfile = infile;
  this->AddCMakeDependFile(sinfile);
  cmSystemTools::ConvertToUnixSlashes(soutfile);

  // Re-generate if non-temporary outputs are missing.
  //when we finalize the configuration we will remove all
  //output files that now don't exist.
  this->AddCMakeOutputFile(soutfile);

  mode_t perm = 0;
  cmSystemTools::GetPermissions(sinfile.c_str(), perm);
  std::string::size_type pos = soutfile.rfind('/');
  if(pos != std::string::npos)
    {
    std::string path = soutfile.substr(0, pos);
    cmSystemTools::MakeDirectory(path.c_str());
    }

  if(copyonly)
    {
    if ( !cmSystemTools::CopyFileIfDifferent(sinfile.c_str(),
                                             soutfile.c_str()))
      {
      return 0;
      }
    }
  else
    {
    std::string newLineCharacters;
    std::ios_base::openmode omode = std::ios_base::out | std::ios_base::trunc;
    if (newLine.IsValid())
      {
      newLineCharacters = newLine.GetCharacters();
      omode |= std::ios::binary;
      }
    else
      {
      newLineCharacters = "\n";
      }
    std::string tempOutputFile = soutfile;
    tempOutputFile += ".tmp";
    cmsys::ofstream fout(tempOutputFile.c_str(), omode);
    if(!fout)
      {
      cmSystemTools::Error(
        "Could not open file for write in copy operation ",
        tempOutputFile.c_str());
      cmSystemTools::ReportLastSystemError("");
      return 0;
      }
    cmsys::ifstream fin(sinfile.c_str());
    if(!fin)
      {
      cmSystemTools::Error("Could not open file for read in copy operation ",
                           sinfile.c_str());
      return 0;
      }

    cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
    if(bom != cmsys::FStream::BOM_None &&
       bom != cmsys::FStream::BOM_UTF8)
      {
      std::ostringstream e;
      e << "File starts with a Byte-Order-Mark that is not UTF-8:\n  "
        << sinfile;
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return 0;
      }
    // rewind to copy BOM to output file
    fin.seekg(0);


    // now copy input to output and expand variables in the
    // input file at the same time
    std::string inLine;
    std::string outLine;
    while( cmSystemTools::GetLineFromStream(fin, inLine) )
      {
      outLine = "";
      this->ConfigureString(inLine, outLine, atOnly, escapeQuotes);
      fout << outLine.c_str() << newLineCharacters;
      }
    // close the files before attempting to copy
    fin.close();
    fout.close();
    if ( !cmSystemTools::CopyFileIfDifferent(tempOutputFile.c_str(),
                                             soutfile.c_str()) )
      {
      res = 0;
      }
    else
      {
      cmSystemTools::SetPermissions(soutfile.c_str(), perm);
      }
    cmSystemTools::RemoveFile(tempOutputFile);
    }
  return res;
}